

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.cpp
# Opt level: O2

void __thiscall
duckdb::ValidityMask::Slice(ValidityMask *this,ValidityMask *other,idx_t source_offset,idx_t count)

{
  ValidityMask new_mask;
  TemplatedValidityMask<unsigned_long> local_28;
  
  if ((other->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    (this->super_TemplatedValidityMask<unsigned_long>).validity_mask = (unsigned_long *)0x0;
    ::std::__shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>::
    reset((__shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2> *)
          &(this->super_TemplatedValidityMask<unsigned_long>).validity_data);
    return;
  }
  if (source_offset != 0) {
    local_28.validity_mask = (unsigned_long *)0x0;
    local_28.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_28.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_28.capacity = count;
    SliceInPlace((ValidityMask *)&local_28,other,0,source_offset,count);
    TemplatedValidityMask<unsigned_long>::Initialize
              (&this->super_TemplatedValidityMask<unsigned_long>,&local_28);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_28.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    return;
  }
  TemplatedValidityMask<unsigned_long>::Initialize
            (&this->super_TemplatedValidityMask<unsigned_long>,
             &other->super_TemplatedValidityMask<unsigned_long>);
  return;
}

Assistant:

void ValidityMask::Slice(const ValidityMask &other, idx_t source_offset, idx_t count) {
	if (other.AllValid()) {
		validity_mask = nullptr;
		validity_data.reset();
		return;
	}
	if (source_offset == 0) {
		Initialize(other);
		return;
	}
	ValidityMask new_mask(count);
	new_mask.SliceInPlace(other, 0, source_offset, count);
	Initialize(new_mask);
}